

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::symms_osh2inria(Omega_h *this,Int dim,Reals *symms)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Reals RVar2;
  Read<double> local_60;
  Read<double> local_50 [2];
  Read<double> local_30;
  Reals *local_20;
  Reals *symms_local;
  Omega_h *pOStack_10;
  Int dim_local;
  
  local_20 = symms;
  symms_local._4_4_ = dim;
  pOStack_10 = this;
  if (dim == 3) {
    Read<double>::Read(&local_30,symms);
    symms_osh2inria_dim<3>(this,&local_30);
    Read<double>::~Read(&local_30);
    pvVar1 = extraout_RDX;
  }
  else if (dim == 2) {
    Read<double>::Read(local_50,symms);
    symms_osh2inria_dim<2>(this,local_50);
    Read<double>::~Read(local_50);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (dim != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x7f);
    }
    Read<double>::Read(&local_60,symms);
    symms_osh2inria_dim<1>(this,&local_60);
    Read<double>::~Read(&local_60);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals symms_osh2inria(Int dim, Reals symms) {
  if (dim == 3) return symms_osh2inria_dim<3>(symms);
  if (dim == 2) return symms_osh2inria_dim<2>(symms);
  if (dim == 1) return symms_osh2inria_dim<1>(symms);
  OMEGA_H_NORETURN(Reals());
}